

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void flatbuffers::GenStruct
               (StructDef *struct_def,Table *table,int indent,int indent_step,string *_text)

{
  Value *pVVar1;
  BaseType BVar2;
  FieldDef *fd;
  Table val;
  ushort uVar3;
  short val_00;
  unsigned_short val_01;
  int indent_00;
  uint uVar4;
  ulong uVar5;
  pointer ppFVar6;
  int iVar7;
  uint uVar8;
  int val_02;
  Table *val_03;
  long val_04;
  unsigned_long val_05;
  float val_06;
  undefined4 uVar9;
  undefined4 uVar10;
  StructDef *local_50;
  
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::append((char *)_text);
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar6 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    indent_00 = indent + indent_step;
    iVar7 = 0;
    local_50 = (StructDef *)0x0;
    do {
      fd = *ppFVar6;
      if (struct_def->fixed == false) {
        uVar4 = (fd->value).offset;
        if (((ushort)uVar4 < *(ushort *)(table + -(long)*(int *)table)) &&
           (*(short *)(table + ((ulong)(uVar4 & 0xffff) - (long)*(int *)table)) != 0))
        goto LAB_001121e3;
      }
      else {
LAB_001121e3:
        if (iVar7 != 0) {
          std::__cxx11::string::append((char *)_text);
          std::__cxx11::string::append((char *)_text);
        }
        std::__cxx11::string::_M_replace_aux((ulong)_text,_text->_M_string_length,0,(char)indent_00)
        ;
        std::__cxx11::string::_M_append
                  ((char *)_text,(ulong)(fd->super_Definition).name._M_dataplus._M_p);
        std::__cxx11::string::append((char *)_text);
        pVVar1 = &fd->value;
        BVar2 = (fd->value).type.base_type;
        switch(BVar2) {
        case BASE_TYPE_NONE:
        case BASE_TYPE_UTYPE:
        case BASE_TYPE_BOOL:
        case BASE_TYPE_UCHAR:
          GenField<unsigned_char>(fd,table,struct_def->fixed,indent_00,indent_step,_text);
          break;
        case BASE_TYPE_CHAR:
          uVar4 = (fd->value).offset;
          if (struct_def->fixed == true) {
LAB_00112618:
            val = table[uVar4];
          }
          else {
            if ((ushort)uVar4 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)(ushort)uVar4 - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 != 0) {
              uVar4 = (uint)uVar3;
              goto LAB_00112618;
            }
            val = (Table)0x0;
          }
          Print<signed_char>((char)val,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_SHORT:
          uVar4 = (fd->value).offset;
          if (struct_def->fixed == true) {
LAB_001126ce:
            val_00 = *(short *)(table + uVar4);
          }
          else {
            if ((ushort)uVar4 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)(ushort)uVar4 - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 != 0) {
              uVar4 = (uint)uVar3;
              goto LAB_001126ce;
            }
            val_00 = 0;
          }
          Print<short>(val_00,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_USHORT:
          uVar4 = (fd->value).offset;
          if (struct_def->fixed == true) {
LAB_0011270d:
            val_01 = *(unsigned_short *)(table + uVar4);
          }
          else {
            if ((ushort)uVar4 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)(ushort)uVar4 - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 != 0) {
              uVar4 = (uint)uVar3;
              goto LAB_0011270d;
            }
            val_01 = 0;
          }
          Print<unsigned_short>(val_01,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_INT:
          uVar4 = (fd->value).offset;
          uVar5 = (ulong)uVar4;
          if (struct_def->fixed == true) {
LAB_00112460:
            val_02 = *(int *)(table + uVar5);
          }
          else {
            val_02 = 0;
            uVar5 = 0;
            uVar3 = (ushort)uVar4;
            if (uVar3 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar5 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table));
            }
            if ((short)uVar5 != 0) goto LAB_00112460;
          }
          Print<int>(val_02,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_UINT:
          uVar4 = (fd->value).offset;
          uVar5 = (ulong)uVar4;
          if (struct_def->fixed == true) {
LAB_0011257f:
            uVar8 = *(uint *)(table + uVar5);
          }
          else {
            uVar8 = 0;
            uVar5 = 0;
            uVar3 = (ushort)uVar4;
            if (uVar3 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar5 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table));
            }
            if ((short)uVar5 != 0) goto LAB_0011257f;
          }
          Print<unsigned_int>(uVar8,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_LONG:
          uVar4 = (fd->value).offset;
          uVar5 = (ulong)uVar4;
          if (struct_def->fixed == true) {
LAB_00112693:
            val_04 = *(long *)(table + uVar5);
          }
          else {
            uVar3 = (ushort)uVar4;
            if (uVar3 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 != 0) {
              uVar5 = (ulong)uVar3;
              goto LAB_00112693;
            }
            val_04 = 0;
          }
          Print<long>(val_04,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_ULONG:
          uVar4 = (fd->value).offset;
          uVar5 = (ulong)uVar4;
          if (struct_def->fixed == true) {
LAB_00112749:
            val_05 = *(unsigned_long *)(table + uVar5);
          }
          else {
            uVar3 = (ushort)uVar4;
            if (uVar3 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 != 0) {
              uVar5 = (ulong)uVar3;
              goto LAB_00112749;
            }
            val_05 = 0;
          }
          Print<unsigned_long>(val_05,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_FLOAT:
          uVar4 = (fd->value).offset;
          uVar5 = (ulong)uVar4;
          if (struct_def->fixed == true) {
LAB_001125db:
            val_06 = *(float *)(table + uVar5);
          }
          else {
            uVar3 = (ushort)uVar4;
            if (uVar3 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 != 0) {
              uVar5 = (ulong)uVar3;
              goto LAB_001125db;
            }
            val_06 = 0.0;
          }
          Print<float>(val_06,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_DOUBLE:
          uVar4 = (fd->value).offset;
          uVar5 = (ulong)uVar4;
          if (struct_def->fixed == true) {
LAB_00112656:
            uVar9 = (undefined4)*(undefined8 *)(table + uVar5);
            uVar10 = (undefined4)((ulong)*(undefined8 *)(table + uVar5) >> 0x20);
          }
          else {
            uVar3 = (ushort)uVar4;
            if (uVar3 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 != 0) {
              uVar5 = (ulong)uVar3;
              goto LAB_00112656;
            }
            uVar9 = 0;
            uVar10 = 0;
          }
          Print<double>((double)CONCAT44(uVar10,uVar9),pVVar1->type,indent_step,indent_00,
                        (StructDef *)0x0,_text);
          break;
        case BASE_TYPE_STRING:
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_STRUCT:
        case BASE_TYPE_UNION:
          if (struct_def->fixed == true) {
            if ((BVar2 != BASE_TYPE_STRUCT) || (((fd->value).type.struct_def)->fixed == false)) {
              __assert_fail("IsStruct(fd.value.type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                            ,0x98,
                            "void flatbuffers::GenFieldOffset(const FieldDef &, const Table *, bool, int, int, StructDef *, std::string *)"
                           );
            }
            val_03 = table + (uint)(fd->value).offset;
          }
          else if ((BVar2 == BASE_TYPE_STRUCT) && (((fd->value).type.struct_def)->fixed == true)) {
            uVar4 = (fd->value).offset;
            if ((ushort)uVar4 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)(uVar4 & 0xffff) - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            val_03 = (Table *)0x0;
            if (uVar3 != 0) {
              val_03 = table + uVar3;
            }
          }
          else {
            uVar4 = (fd->value).offset;
            if ((ushort)uVar4 < *(ushort *)(table + -(long)*(int *)table)) {
              uVar3 = *(ushort *)(table + ((ulong)(uVar4 & 0xffff) - (long)*(int *)table));
            }
            else {
              uVar3 = 0;
            }
            if (uVar3 == 0) {
              val_03 = (Table *)0x0;
            }
            else {
              val_03 = table + (ulong)*(uint *)(table + uVar3) + (ulong)uVar3;
            }
          }
          Print<void_const*>(val_03,pVVar1->type,indent_00,indent_step,local_50,_text);
        }
        iVar7 = iVar7 + 1;
        if ((pVVar1->type).base_type == BASE_TYPE_UTYPE) {
          uVar4 = (fd->value).offset;
          uVar8 = 0;
          uVar3 = 0;
          if ((ushort)uVar4 < *(ushort *)(table + -(long)*(int *)table)) {
            uVar3 = *(ushort *)(table + ((ulong)(uVar4 & 0xffff) - (long)*(int *)table));
          }
          if (uVar3 != 0) {
            uVar8 = (uint)(byte)table[uVar3];
          }
          local_50 = EnumDef::ReverseLookup((fd->value).type.enum_def,uVar8);
        }
      }
      ppFVar6 = ppFVar6 + 1;
    } while (ppFVar6 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::_M_replace_aux((ulong)_text,_text->_M_string_length,0,(char)indent);
  std::__cxx11::string::append((char *)_text);
  return;
}

Assistant:

static void GenStruct(const StructDef &struct_def, const Table *table,
                      int indent, int indent_step, std::string *_text) {
  std::string &text = *_text;
  text += "{";
  text += NewLine(indent_step);
  int fieldout = 0;
  StructDef *union_sd = nullptr;
  for (auto it = struct_def.fields.vec.begin();
       it != struct_def.fields.vec.end();
       ++it) {
    FieldDef &fd = **it;
    if (struct_def.fixed || table->CheckField(fd.value.offset)) {
      // The field is present.
      if (fieldout++) {
        text += ",";
        text += NewLine(indent_step);
      }
      text.append(indent + indent_step, ' ');
      text += fd.name;
      text += ": ";
      switch (fd.value.type.base_type) {
         #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
           case BASE_TYPE_ ## ENUM: \
              GenField<CTYPE>(fd, table, struct_def.fixed, \
                              indent + indent_step, indent_step, _text); \
              break;
          FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
          case BASE_TYPE_ ## ENUM:
          FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            GenFieldOffset(fd, table, struct_def.fixed, indent + indent_step,
                           indent_step, union_sd, _text);
            break;
      }
      if (fd.value.type.base_type == BASE_TYPE_UTYPE) {
        union_sd = fd.value.type.enum_def->ReverseLookup(
                                 table->GetField<uint8_t>(fd.value.offset, 0));
      }
    }
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "}";
}